

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::tydra::anon_unknown_6::GetPrimProperty<tinyusdz::Shader>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Shader *shader,string *prop_name,Property *out_prop)

{
  size_type *psVar1;
  Value *this;
  vtable_type *pvVar2;
  size_type sVar3;
  int iVar4;
  UsdPrimvarReader<std::array<float,_4UL>_> *pUVar5;
  const_iterator cVar6;
  UsdTransform2d *tx;
  UsdUVTexture *tex;
  UsdPreviewSurface *surface;
  string *extraout_RDX;
  string *extraout_RDX_00;
  string *err;
  string *extraout_RDX_01;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *input;
  _Alloc_hider local_90;
  undefined8 local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (out_prop == (Property *)0x0) {
    local_90._M_p = "[InternalError] nullptr in output Property is not allowed.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&local_90);
    return __return_storage_ptr__;
  }
  this = &shader->value;
  pUVar5 = (UsdPrimvarReader<std::array<float,_4UL>_> *)
           tinyusdz::value::Value::as<tinyusdz::UsdPrimvarReader<float>>(this,false);
  if (pUVar5 == (UsdPrimvarReader<std::array<float,_4UL>_> *)0x0) {
    pUVar5 = (UsdPrimvarReader<std::array<float,_4UL>_> *)
             tinyusdz::value::Value::as<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
                       (this,false);
    if ((pUVar5 == (UsdPrimvarReader<std::array<float,_4UL>_> *)0x0) &&
       (pUVar5 = (UsdPrimvarReader<std::array<float,_4UL>_> *)
                 tinyusdz::value::Value::as<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>
                           (this,false), pUVar5 == (UsdPrimvarReader<std::array<float,_4UL>_> *)0x0)
       ) {
      pUVar5 = tinyusdz::value::Value::as<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
                         (this,false);
      if (pUVar5 == (UsdPrimvarReader<std::array<float,_4UL>_> *)0x0) {
        tx = tinyusdz::value::Value::as<tinyusdz::UsdTransform2d>(this,false);
        if (tx != (UsdTransform2d *)0x0) {
          GetPrimProperty<tinyusdz::UsdTransform2d>(__return_storage_ptr__,tx,prop_name,out_prop);
          return __return_storage_ptr__;
        }
        tex = tinyusdz::value::Value::as<tinyusdz::UsdUVTexture>(this,false);
        if (tex != (UsdUVTexture *)0x0) {
          GetPrimProperty<tinyusdz::UsdUVTexture>(__return_storage_ptr__,tex,prop_name,out_prop);
          return __return_storage_ptr__;
        }
        surface = tinyusdz::value::Value::as<tinyusdz::UsdPreviewSurface>(this,false);
        if (surface != (UsdPreviewSurface *)0x0) {
          GetPrimProperty<tinyusdz::UsdPreviewSurface>
                    (__return_storage_ptr__,surface,prop_name,out_prop);
          return __return_storage_ptr__;
        }
        pvVar2 = (shader->value).v_.vtable;
        if (pvVar2 == (vtable_type *)0x0) {
          local_70.field_2._M_allocated_capacity._0_4_ = 0x64696f76;
          local_70._M_string_length = 4;
          local_70.field_2._M_allocated_capacity._4_4_ =
               local_70.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          (*pvVar2->type_name)(&local_70);
        }
        ::std::operator+(&local_50,"TODO: ",&local_70);
        sVar3 = local_50._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) {
          local_80._8_8_ = local_50.field_2._8_8_;
          local_90._M_p = (pointer)&local_80;
        }
        else {
          local_90._M_p = local_50._M_dataplus._M_p;
        }
        local_80._M_allocated_capacity._1_7_ = local_50.field_2._M_allocated_capacity._1_7_;
        local_80._M_local_buf[0] = local_50.field_2._M_local_buf[0];
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = false;
        psVar1 = (size_type *)
                 ((long)&(__return_storage_ptr__->contained).
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .field_0 + 0x10);
        *(size_type **)
         &(__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0 = psVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_p == &local_80) {
          *psVar1 = local_80._M_allocated_capacity;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->contained).
                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .field_0 + 0x18) = local_80._8_8_;
        }
        else {
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_error._M_dataplus._M_p = local_90._M_p;
          *(size_type *)
           ((long)&(__return_storage_ptr__->contained).
                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .field_0 + 0x10) = local_80._M_allocated_capacity;
        }
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_error._M_string_length = sVar3;
        local_88 = 0;
        local_80._M_allocated_capacity =
             (ulong)(uint7)local_50.field_2._M_allocated_capacity._1_7_ << 8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == &local_70.field_2) {
          return __return_storage_ptr__;
        }
        uVar7 = CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                         local_70.field_2._M_allocated_capacity._0_4_);
        _Var8._M_p = local_70._M_dataplus._M_p;
        local_90._M_p = (pointer)&local_80;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        goto LAB_004f13f0;
      }
      local_90._M_p = (pointer)&local_80;
      local_88 = 0;
      local_80._M_allocated_capacity = local_80._M_allocated_capacity & 0xffffffffffffff00;
      iVar4 = ::std::__cxx11::string::compare((char *)prop_name);
      if (iVar4 == 0) {
        input = &pUVar5->varname;
        err = extraout_RDX_01;
        goto LAB_004f13cf;
      }
    }
    else {
      local_90._M_p = (pointer)&local_80;
      local_88 = 0;
      local_80._M_allocated_capacity = local_80._M_allocated_capacity & 0xffffffffffffff00;
      iVar4 = ::std::__cxx11::string::compare((char *)prop_name);
      if (iVar4 == 0) {
        input = (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&(pUVar5->fallback)._blocked;
        err = extraout_RDX_00;
        goto LAB_004f13cf;
      }
    }
LAB_004f1279:
    cVar6 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::find(&(pUVar5->super_ShaderNode).super_UsdShadePrim.props._M_t,prop_name);
    if ((_Rb_tree_header *)cVar6._M_node !=
        &(pUVar5->super_ShaderNode).super_UsdShadePrim.props._M_t._M_impl.super__Rb_tree_header) {
      ::std::__cxx11::string::_M_assign((string *)out_prop);
      (out_prop->_attrib)._varying_authored = (bool)cVar6._M_node[3].field_0x4;
      (out_prop->_attrib)._variability = cVar6._M_node[3]._M_color;
      ::std::__cxx11::string::_M_assign((string *)&(out_prop->_attrib)._type_name);
      linb::any::operator=((any *)&(out_prop->_attrib)._var,(any *)&cVar6._M_node[4]._M_parent);
      (out_prop->_attrib)._var._blocked = SUB41(cVar6._M_node[5]._M_color,0);
      ::std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)&(out_prop->_attrib)._var._ts,
                  (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)&cVar6._M_node[5]._M_parent);
      (out_prop->_attrib)._var._ts._dirty = SUB41(cVar6._M_node[6]._M_color,0);
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                (&(out_prop->_attrib)._paths,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                 &cVar6._M_node[6]._M_parent);
      AttrMetas::operator=(&(out_prop->_attrib)._metas,(AttrMetas *)(cVar6._M_node + 7));
      *(_Base_ptr *)&out_prop->_listOpQual = cVar6._M_node[0x17]._M_parent;
      (out_prop->_rel).type = *(Type *)&cVar6._M_node[0x17]._M_left;
      Path::operator=(&(out_prop->_rel).targetPath,(Path *)&cVar6._M_node[0x17]._M_right);
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                (&(out_prop->_rel).targetPathVector,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                 &cVar6._M_node[0x1e]._M_parent);
      (out_prop->_rel).listOpQual = cVar6._M_node[0x1f]._M_color;
      AttrMetas::operator=(&(out_prop->_rel)._metas,(AttrMetas *)&cVar6._M_node[0x1f]._M_parent);
      (out_prop->_rel)._varying_authored = *(bool *)&cVar6._M_node[0x2f]._M_left;
      ::std::__cxx11::string::_M_assign((string *)&out_prop->_prop_value_type_name);
      out_prop->_has_custom = *(bool *)&cVar6._M_node[0x30]._M_right;
      goto LAB_004f13da;
    }
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = false;
  }
  else {
    local_90._M_p = (pointer)&local_80;
    local_88 = 0;
    local_80._M_allocated_capacity = local_80._M_allocated_capacity & 0xffffffffffffff00;
    iVar4 = ::std::__cxx11::string::compare((char *)prop_name);
    if (iVar4 != 0) goto LAB_004f1279;
    input = (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&(pUVar5->fallback)._attrib.contained + 0x30);
    err = extraout_RDX;
LAB_004f13cf:
    (anonymous_namespace)::ToProperty<std::__cxx11::string>(input,out_prop,err);
LAB_004f13da:
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = true;
  }
  uVar7 = local_80._M_allocated_capacity;
  _Var8._M_p = local_90._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p == &local_80) {
    return __return_storage_ptr__;
  }
LAB_004f13f0:
  operator_delete(_Var8._M_p,uVar7 + 1);
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> GetPrimProperty(
    const Shader &shader, const std::string &prop_name, Property *out_prop) {
  if (!out_prop) {
    return nonstd::make_unexpected(
        "[InternalError] nullptr in output Property is not allowed.");
  }

  if (const auto preader_f = shader.value.as<UsdPrimvarReader_float>()) {
    return GetPrimProperty(*preader_f, prop_name, out_prop);
  } else if (const auto preader_f2 =
                 shader.value.as<UsdPrimvarReader_float2>()) {
    return GetPrimProperty(*preader_f2, prop_name, out_prop);
  } else if (const auto preader_f3 =
                 shader.value.as<UsdPrimvarReader_float3>()) {
    return GetPrimProperty(*preader_f3, prop_name, out_prop);
  } else if (const auto preader_f4 =
                 shader.value.as<UsdPrimvarReader_float4>()) {
    return GetPrimProperty(*preader_f4, prop_name, out_prop);
  } else if (const auto ptx2d = shader.value.as<UsdTransform2d>()) {
    return GetPrimProperty(*ptx2d, prop_name, out_prop);
  } else if (const auto ptex = shader.value.as<UsdUVTexture>()) {
    return GetPrimProperty(*ptex, prop_name, out_prop);
  } else if (const auto psurf = shader.value.as<UsdPreviewSurface>()) {
    return GetPrimProperty(*psurf, prop_name, out_prop);
  } else {
    return nonstd::make_unexpected("TODO: " + shader.value.type_name());
  }
}